

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(ImRect *r_in,ImRect *r_outer,float threshold)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = (r_in->Min).x <= (r_outer->Min).x + threshold;
  bVar2 = (r_outer->Max).x - threshold <= (r_in->Max).x;
  bVar3 = (r_in->Min).y <= threshold + (r_outer->Min).y;
  bVar4 = (r_outer->Max).y - threshold <= (r_in->Max).y;
  return (uint)(bVar4 && bVar2) << 7 |
         (uint)(bVar1 && bVar4) << 6 | (uint)(bVar3 && bVar2) << 5 | (uint)(bVar3 && bVar1) << 4 |
         0x100;
}

Assistant:

ImDrawFlags ImGui::CalcRoundingFlagsForRectInRect(const ImRect& r_in, const ImRect& r_outer, float threshold)
{
    bool round_l = r_in.Min.x <= r_outer.Min.x + threshold;
    bool round_r = r_in.Max.x >= r_outer.Max.x - threshold;
    bool round_t = r_in.Min.y <= r_outer.Min.y + threshold;
    bool round_b = r_in.Max.y >= r_outer.Max.y - threshold;
    return ImDrawFlags_RoundCornersNone
        | ((round_t && round_l) ? ImDrawFlags_RoundCornersTopLeft : 0) | ((round_t && round_r) ? ImDrawFlags_RoundCornersTopRight : 0)
        | ((round_b && round_l) ? ImDrawFlags_RoundCornersBottomLeft : 0) | ((round_b && round_r) ? ImDrawFlags_RoundCornersBottomRight : 0);
}